

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O3

void __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Insert
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,char **key)

{
  int iVar1;
  Node *pNVar2;
  uint uVar3;
  __base_type _Var4;
  int i;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Node *prev [12];
  Node *local_78 [12];
  
  FindGreaterOrEqual(this,key,local_78);
  uVar5 = (this->rnd_).seed_;
  uVar3 = 1;
  do {
    uVar6 = (uint)((ulong)uVar5 * 0x41a7) & 0x7fffffff;
    iVar1 = (int)((ulong)uVar5 * 0x41a7 >> 0x1f);
    uVar7 = iVar1 + uVar6;
    uVar5 = iVar1 + uVar6 + 0x80000001;
    if (-1 < (int)uVar7) {
      uVar5 = uVar7;
    }
    if ((uVar5 & 3) != 0) goto LAB_001122b1;
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0xc);
  uVar3 = 0xc;
LAB_001122b1:
  (this->rnd_).seed_ = uVar5;
  if ((this->max_height_).super___atomic_base<int>._M_i < (int)uVar3) {
    iVar1 = (this->max_height_).super___atomic_base<int>._M_i;
    if (iVar1 < (int)uVar3) {
      lVar8 = (long)iVar1;
      pNVar2 = this->head_;
      lVar9 = (ulong)uVar3 - lVar8;
      lVar10 = lVar9 + -1;
      auVar12._8_4_ = (int)lVar10;
      auVar12._0_8_ = lVar10;
      auVar12._12_4_ = (int)((ulong)lVar10 >> 0x20);
      uVar11 = 0;
      auVar12 = auVar12 ^ _DAT_00124c90;
      do {
        auVar13._8_4_ = (int)uVar11;
        auVar13._0_8_ = uVar11;
        auVar13._12_4_ = (int)(uVar11 >> 0x20);
        auVar13 = (auVar13 | _DAT_00124c80) ^ _DAT_00124c90;
        if ((bool)(~(auVar13._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar13._0_4_ ||
                    auVar12._4_4_ < auVar13._4_4_) & 1)) {
          local_78[lVar8 + uVar11] = pNVar2;
        }
        if ((auVar13._12_4_ != auVar12._12_4_ || auVar13._8_4_ <= auVar12._8_4_) &&
            auVar13._12_4_ <= auVar12._12_4_) {
          local_78[lVar8 + uVar11 + 1] = pNVar2;
        }
        uVar11 = uVar11 + 2;
      } while ((lVar9 + 1U & 0xfffffffffffffffe) != uVar11);
    }
    (this->max_height_).super___atomic_base<int>._M_i = uVar3;
  }
  _Var4._M_p = (__pointer_type)Arena::AllocateAligned(this->arena_,(long)(int)uVar3 * 8 + 8);
  (_Var4._M_p)->key = *key;
  uVar11 = 0;
  do {
    pNVar2 = local_78[uVar11];
    *(__pointer_type *)((long)(_Var4._M_p)->next_ + uVar11 * 8) = pNVar2->next_[uVar11]._M_b._M_p;
    pNVar2->next_[uVar11]._M_b._M_p = _Var4._M_p;
    uVar11 = uVar11 + 1;
  } while (uVar3 != uVar11);
  return;
}

Assistant:

void SkipList<Key, Comparator>::Insert(const Key& key) {
  // TODO(opt): We can use a barrier-free variant of FindGreaterOrEqual()
  // here since Insert() is externally synchronized.
  Node* prev[kMaxHeight];
  Node* x = FindGreaterOrEqual(key, prev);

  // Our data structure does not allow duplicate insertion
  assert(x == nullptr || !Equal(key, x->key));

  int height = RandomHeight();
  if (height > GetMaxHeight()) {
    for (int i = GetMaxHeight(); i < height; i++) {
      prev[i] = head_;
    }
    // It is ok to mutate max_height_ without any synchronization
    // with concurrent readers.  A concurrent reader that observes
    // the new value of max_height_ will see either the old value of
    // new level pointers from head_ (nullptr), or a new value set in
    // the loop below.  In the former case the reader will
    // immediately drop to the next level since nullptr sorts after all
    // keys.  In the latter case the reader will use the new node.
    max_height_.store(height, std::memory_order_relaxed);
  }

  x = NewNode(key, height);
  for (int i = 0; i < height; i++) {
    // NoBarrier_SetNext() suffices since we will add a barrier when
    // we publish a pointer to "x" in prev[i].
    x->NoBarrier_SetNext(i, prev[i]->NoBarrier_Next(i));
    prev[i]->SetNext(i, x);
  }
}